

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_posix::collator<char>::collator
          (collator<char> *this,shared_ptr<__locale_struct_*> *l,size_t refs)

{
  shared_ptr<__locale_struct_*> *in_RSI;
  shared_ptr<__locale_struct_*> *in_RDI;
  
  std::__cxx11::collate<char>::collate((ulong)in_RDI);
  (in_RDI->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__collator_002eb4d8;
  std::shared_ptr<__locale_struct_*>::shared_ptr(in_RSI,in_RDI);
  return;
}

Assistant:

collator(booster::shared_ptr<locale_t> l,size_t refs = 0) : 
        std::collate<CharType>(refs),
        lc_(l)
    {
    }